

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.cpp
# Opt level: O0

void __thiscall
QAbstractItemModel::beginInsertColumns
          (QAbstractItemModel *this,QModelIndex *parent,int first,int last)

{
  long lVar1;
  QAbstractItemModelPrivate *pQVar2;
  int in_ECX;
  int in_EDX;
  QModelIndex *in_RSI;
  QAbstractItemModel *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemModelPrivate *d;
  Change *in_stack_ffffffffffffff88;
  QStack<QAbstractItemModelPrivate::Change> *this_00;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  QModelIndex *in_stack_ffffffffffffffd8;
  totally_ordered_wrapper<const_QAbstractItemModel_*> in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QAbstractItemModel *)0x7f5137);
  this_00 = &pQVar2->changes;
  QAbstractItemModelPrivate::Change::Change((Change *)&stack0xffffffffffffffd0,in_RSI,in_EDX,in_ECX)
  ;
  QStack<QAbstractItemModelPrivate::Change>::push(this_00,in_stack_ffffffffffffff88);
  columnsAboutToBeInserted(in_RDI,in_RSI,in_EDX,in_ECX);
  QAbstractItemModelPrivate::columnsAboutToBeInserted
            ((QAbstractItemModelPrivate *)in_stack_ffffffffffffffe0.ptr,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModel::beginInsertColumns(const QModelIndex &parent, int first, int last)
{
    Q_ASSERT(first >= 0);
    Q_ASSERT(first <= columnCount(parent)); // == is allowed, to insert at the end
    Q_ASSERT(last >= first);
    Q_D(QAbstractItemModel);
    d->changes.push(QAbstractItemModelPrivate::Change(parent, first, last));
    emit columnsAboutToBeInserted(parent, first, last, QPrivateSignal());
    d->columnsAboutToBeInserted(parent, first, last);
}